

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

void rsg::anon_unknown_27::genVertexPassthrough(GeneratorState *state,Shader *shader)

{
  ValueEntry *this;
  ValueEntryIterator<rsg::AnyEntry> __first;
  ConstValueRangeAccess value;
  ValueEntryIterator<rsg::AnyEntry> __last;
  bool bVar1;
  Storage SVar2;
  deBool dVar3;
  VariableManager *pVVar4;
  iterator __i;
  reference ppVVar5;
  char *pcVar6;
  VariableType *type;
  Function *this_00;
  BlockStatement *block;
  Variable *pVVar7;
  insert_iterator<std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  iVar8;
  ConstValueRangeAccess local_118;
  Variable *local_100;
  Variable *inVar;
  string local_f0 [8];
  string inVarName;
  Variable *outVar;
  ValueEntry *entry;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_b8;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_b0;
  const_iterator i;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> entries;
  Shader *shader_local;
  GeneratorState *state_local;
  
  entries.super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)shader;
  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::vector
            ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)local_30);
  pVVar4 = GeneratorState::getVariableManager(state);
  VariableManager::getBegin<rsg::AnyEntry>(&local_48,pVVar4);
  pVVar4 = GeneratorState::getVariableManager(state);
  VariableManager::getEnd<rsg::AnyEntry>(&local_78,pVVar4);
  __i = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                  ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                   local_30);
  iVar8 = std::inserter<std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>
                    ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                     local_30,__i);
  __first.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  .m_end._M_current = (ValueEntry **)uStack_40;
  __first.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  .m_iter._M_current = (ValueEntry **)local_48;
  __first.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  ._16_8_ = local_38;
  __last.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  .m_end._M_current = (ValueEntry **)uStack_70;
  __last.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  .m_iter._M_current = (ValueEntry **)local_78;
  __last.
  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::AnyEntry>
  ._16_8_ = local_68;
  iVar8 = std::
          copy<rsg::ValueEntryIterator<rsg::AnyEntry>,std::insert_iterator<std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>>
                    (__first,__last,iVar8);
  i._M_current = (ValueEntry **)iVar8.container;
  local_b8._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                 ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                  local_30);
  __gnu_cxx::
  __normal_iterator<rsg::ValueEntry_const*const*,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>
  ::__normal_iterator<rsg::ValueEntry_const**>
            ((__normal_iterator<rsg::ValueEntry_const*const*,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>
              *)&local_b0,&local_b8);
  while( true ) {
    entry = (ValueEntry *)
            std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                      ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)
                       local_30);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b0,
                       (__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                        *)&entry);
    if (!bVar1) break;
    ppVVar5 = __gnu_cxx::
              __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
              ::operator*(&local_b0);
    this = *ppVVar5;
    inVarName.field_2._8_8_ = ValueEntry::getVariable(this);
    std::__cxx11::string::string(local_f0);
    SVar2 = rsg::Variable::getStorage((Variable *)inVarName.field_2._8_8_);
    if (SVar2 == STORAGE_SHADER_OUT) {
      std::__cxx11::string::operator=(local_f0,"a_");
      pcVar6 = rsg::Variable::getName((Variable *)inVarName.field_2._8_8_);
      dVar3 = deStringBeginsWith(pcVar6,"v_");
      if (dVar3 == 0) {
        pcVar6 = rsg::Variable::getName((Variable *)inVarName.field_2._8_8_);
        std::__cxx11::string::operator+=(local_f0,pcVar6);
      }
      else {
        pcVar6 = rsg::Variable::getName((Variable *)inVarName.field_2._8_8_);
        std::__cxx11::string::operator+=(local_f0,pcVar6 + 2);
      }
      pVVar4 = GeneratorState::getVariableManager(state);
      type = rsg::Variable::getType((Variable *)inVarName.field_2._8_8_);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_100 = VariableManager::allocate(pVVar4,type,STORAGE_SHADER_IN,pcVar6);
      pVVar4 = GeneratorState::getVariableManager(state);
      pVVar7 = local_100;
      ValueEntry::getValueRange(&local_118,this);
      value.m_min = local_118.m_min;
      value.m_type = local_118.m_type;
      value.m_max = local_118.m_max;
      VariableManager::setValue(pVVar4,pVVar7,value);
      this_00 = rsg::Shader::getMain
                          ((Shader *)
                           entries.
                           super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      block = Function::getBody(this_00);
      pVVar7 = ValueEntry::getVariable(this);
      createAssignment(block,pVVar7,local_100);
      inVar._4_4_ = 0;
    }
    else {
      inVar._4_4_ = 4;
    }
    std::__cxx11::string::~string(local_f0);
    __gnu_cxx::
    __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
    ::operator++(&local_b0,0);
  }
  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::~vector
            ((vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_> *)local_30);
  return;
}

Assistant:

void genVertexPassthrough (GeneratorState& state, Shader& shader)
{
	// Create copies from shader inputs to outputs
	vector<const ValueEntry*> entries;
	std::copy(state.getVariableManager().getBegin<AnyEntry>(), state.getVariableManager().getEnd<AnyEntry>(), std::inserter(entries, entries.begin()));

	for (vector<const ValueEntry*>::const_iterator i = entries.begin(); i != entries.end(); i++)
	{
		const ValueEntry*	entry		= *i;
		const Variable*		outVar		= entry->getVariable();
		std::string			inVarName;

		if (outVar->getStorage() != Variable::STORAGE_SHADER_OUT)
			continue;

		// Name: a_[name], remove v_ -prefix if such exists
		inVarName = "a_";
		if (deStringBeginsWith(outVar->getName(), "v_"))
			inVarName += (outVar->getName()+2);
		else
			inVarName += outVar->getName();

		Variable* inVar = state.getVariableManager().allocate(outVar->getType(), Variable::STORAGE_SHADER_IN, inVarName.c_str());

		// Update value range. This will be stored into shader input info.
		state.getVariableManager().setValue(inVar, entry->getValueRange());

		// Add assignment from input to output into main() body
		createAssignment(shader.getMain().getBody(), entry->getVariable(), inVar);
	}
}